

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

symbolEncodingType_e
ZSTD_selectEncodingType
          (FSE_repeat *repeatMode,uint *count,uint max,size_t mostFrequent,size_t nbSeq,uint FSELog,
          FSE_CTable *prevCTable,short *defaultNorm,U32 defaultNormLog,
          ZSTD_defaultPolicy_e isDefaultAllowed,ZSTD_strategy strategy)

{
  ushort uVar1;
  uint uVar2;
  uint tableLog;
  size_t sVar3;
  ulong uVar4;
  byte bVar5;
  short sVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong local_2b8;
  S16 norm [53];
  BYTE wksp [512];
  
  if (mostFrequent == nbSeq) {
    *repeatMode = FSE_repeat_none;
    return (uint)(2 < mostFrequent || isDefaultAllowed == ZSTD_defaultDisallowed);
  }
  bVar5 = (byte)defaultNormLog;
  if (strategy < ZSTD_lazy) {
    if (isDefaultAllowed != ZSTD_defaultDisallowed) {
      if ((nbSeq < 1000) && (*repeatMode == FSE_repeat_valid)) {
        return set_repeat;
      }
      if ((nbSeq < ((ulong)(10 - strategy) << (bVar5 & 0x3f)) >> 3) ||
         (mostFrequent < nbSeq >> (bVar5 - 1 & 0x3f))) goto LAB_003b677e;
    }
  }
  else {
    uVar12 = 0xffffffffffffffff;
    local_2b8 = 0xffffffffffffffff;
    if (isDefaultAllowed != ZSTD_defaultDisallowed) {
      uVar12 = 0;
      for (uVar9 = 0; max + 1 != uVar9; uVar9 = uVar9 + 1) {
        sVar6 = defaultNorm[uVar9];
        if (sVar6 == -1) {
          sVar6 = 1;
        }
        uVar12 = uVar12 + kInverseProbabiltyLog256[(uint)((int)sVar6 << (8 - bVar5 & 0x1f))] *
                          count[uVar9];
      }
      uVar12 = uVar12 >> 8;
    }
    if (*repeatMode != FSE_repeat_none) {
      uVar1 = (ushort)*prevCTable;
      bVar5 = (byte)uVar1;
      uVar9 = (long)(1 << (bVar5 - 1 & 0x1f));
      if (uVar1 == 0) {
        uVar9 = 1;
      }
      if (max <= *(ushort *)((long)prevCTable + 2)) {
        uVar10 = 0;
        for (lVar11 = 0; (ulong)max + 1 != lVar11; lVar11 = lVar11 + 1) {
          iVar7 = (prevCTable[uVar9 + lVar11 * 2 + 2] >> 0x10) + 1;
          if (count[lVar11] != 0) {
            uVar8 = iVar7 * 0x100 -
                    (iVar7 * 0x1000000 +
                     (prevCTable[uVar9 + lVar11 * 2 + 2] + (1 << (bVar5 & 0x1f))) * -0x100 >>
                    (bVar5 & 0x1f));
            if ((uint)uVar1 * 0x100 + 0x100 <= uVar8) goto LAB_003b66cf;
            uVar10 = uVar10 + uVar8 * count[lVar11];
          }
        }
        local_2b8 = uVar10 >> 8;
      }
    }
LAB_003b66cf:
    uVar8 = FSE_optimalTableLog(FSELog,nbSeq,max);
    sVar3 = FSE_normalizeCount(norm,uVar8,count,nbSeq,max);
    if (sVar3 < 0xffffffffffffff89) {
      sVar3 = FSE_writeNCount(wksp,0x200,norm,max,uVar8);
    }
    uVar8 = 0;
    for (uVar9 = 0; max + 1 != uVar9; uVar9 = uVar9 + 1) {
      uVar2 = count[uVar9];
      uVar4 = (uVar2 << 8) / nbSeq;
      uVar10 = uVar4;
      if (uVar2 << 8 < nbSeq) {
        uVar10 = 1;
      }
      if (uVar2 == 0) {
        uVar10 = uVar4;
      }
      uVar8 = uVar8 + uVar2 * kInverseProbabiltyLog256[uVar10];
    }
    uVar9 = (ulong)(uVar8 >> 8) + sVar3 * 8;
    if ((uVar12 <= local_2b8) && (uVar12 <= uVar9)) {
LAB_003b677e:
      *repeatMode = FSE_repeat_none;
      return set_basic;
    }
    if (local_2b8 <= uVar9) {
      return set_repeat;
    }
  }
  *repeatMode = FSE_repeat_check;
  return set_compressed;
}

Assistant:

MEM_STATIC symbolEncodingType_e
ZSTD_selectEncodingType(
        FSE_repeat* repeatMode, unsigned const* count, unsigned const max,
        size_t const mostFrequent, size_t nbSeq, unsigned const FSELog,
        FSE_CTable const* prevCTable,
        short const* defaultNorm, U32 defaultNormLog,
        ZSTD_defaultPolicy_e const isDefaultAllowed,
        ZSTD_strategy const strategy)
{
    ZSTD_STATIC_ASSERT(ZSTD_defaultDisallowed == 0 && ZSTD_defaultAllowed != 0);
    if (mostFrequent == nbSeq) {
        *repeatMode = FSE_repeat_none;
        if (isDefaultAllowed && nbSeq <= 2) {
            /* Prefer set_basic over set_rle when there are 2 or less symbols,
             * since RLE uses 1 byte, but set_basic uses 5-6 bits per symbol.
             * If basic encoding isn't possible, always choose RLE.
             */
            DEBUGLOG(5, "Selected set_basic");
            return set_basic;
        }
        DEBUGLOG(5, "Selected set_rle");
        return set_rle;
    }
    if (strategy < ZSTD_lazy) {
        if (isDefaultAllowed) {
            size_t const staticFse_nbSeq_max = 1000;
            size_t const mult = 10 - strategy;
            size_t const baseLog = 3;
            size_t const dynamicFse_nbSeq_min = (((size_t)1 << defaultNormLog) * mult) >> baseLog;  /* 28-36 for offset, 56-72 for lengths */
            assert(defaultNormLog >= 5 && defaultNormLog <= 6);  /* xx_DEFAULTNORMLOG */
            assert(mult <= 9 && mult >= 7);
            if ( (*repeatMode == FSE_repeat_valid)
              && (nbSeq < staticFse_nbSeq_max) ) {
                DEBUGLOG(5, "Selected set_repeat");
                return set_repeat;
            }
            if ( (nbSeq < dynamicFse_nbSeq_min)
              || (mostFrequent < (nbSeq >> (defaultNormLog-1))) ) {
                DEBUGLOG(5, "Selected set_basic");
                /* The format allows default tables to be repeated, but it isn't useful.
                 * When using simple heuristics to select encoding type, we don't want
                 * to confuse these tables with dictionaries. When running more careful
                 * analysis, we don't need to waste time checking both repeating tables
                 * and default tables.
                 */
                *repeatMode = FSE_repeat_none;
                return set_basic;
            }
        }
    } else {
        size_t const basicCost = isDefaultAllowed ? ZSTD_crossEntropyCost(defaultNorm, defaultNormLog, count, max) : ERROR(GENERIC);
        size_t const repeatCost = *repeatMode != FSE_repeat_none ? ZSTD_fseBitCost(prevCTable, count, max) : ERROR(GENERIC);
        size_t const NCountCost = ZSTD_NCountCost(count, max, nbSeq, FSELog);
        size_t const compressedCost = (NCountCost << 3) + ZSTD_entropyCost(count, max, nbSeq);

        if (isDefaultAllowed) {
            assert(!ZSTD_isError(basicCost));
            assert(!(*repeatMode == FSE_repeat_valid && ZSTD_isError(repeatCost)));
        }
        assert(!ZSTD_isError(NCountCost));
        assert(compressedCost < ERROR(maxCode));
        DEBUGLOG(5, "Estimated bit costs: basic=%u\trepeat=%u\tcompressed=%u",
                    (unsigned)basicCost, (unsigned)repeatCost, (unsigned)compressedCost);
        if (basicCost <= repeatCost && basicCost <= compressedCost) {
            DEBUGLOG(5, "Selected set_basic");
            assert(isDefaultAllowed);
            *repeatMode = FSE_repeat_none;
            return set_basic;
        }
        if (repeatCost <= compressedCost) {
            DEBUGLOG(5, "Selected set_repeat");
            assert(!ZSTD_isError(repeatCost));
            return set_repeat;
        }
        assert(compressedCost < basicCost && compressedCost < repeatCost);
    }
    DEBUGLOG(5, "Selected set_compressed");
    *repeatMode = FSE_repeat_check;
    return set_compressed;
}